

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O2

int reserve_fields(flatcc_builder_t *B,int count)

{
  flatbuffers_voffset_t *pfVar1;
  int iVar2;
  
  pfVar1 = (flatbuffers_voffset_t *)
           reserve_buffer(B,0,(ulong)(B->frame->container).table.vs_end +
                              (ulong)(B->frame->container).table.id_end * 2,(long)count * 2 + 4,1);
  B->vs = pfVar1;
  if (pfVar1 == (flatbuffers_voffset_t *)0x0) {
    iVar2 = -1;
  }
  else {
    B->vs = pfVar1 + 2;
    pfVar1 = (flatbuffers_voffset_t *)
             reserve_buffer(B,3,(ulong)(B->frame->container).table.pl_end,(long)count * 2 + 1,0);
    B->pl = pfVar1;
    iVar2 = -(uint)(pfVar1 == (flatbuffers_voffset_t *)0x0);
  }
  return iVar2;
}

Assistant:

static inline int reserve_fields(flatcc_builder_t *B, int count)
{
    size_t used, need;

    /* Provide faster stack operations for common table operations. */
    used = frame(container.table.vs_end) + frame(container.table.id_end) * sizeof(voffset_t);
    need = (size_t)(count + 2) * sizeof(voffset_t);
    if (!(B->vs = reserve_buffer(B, flatcc_builder_alloc_vs, used, need, 1))) {
        return -1;
    }
    /* Move past header for convenience. */
    B->vs += 2;
    used = frame(container.table.pl_end);
    /* Add one to handle special case of first table being empty. */
    need = (size_t)count * sizeof(*(B->pl)) + 1;
    if (!(B->pl = reserve_buffer(B, flatcc_builder_alloc_pl, used, need, 0))) {
        return -1;
    }
    return 0;
}